

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

uint __thiscall
TArray<FOptionValues::Pair,_FOptionValues::Pair>::Reserve
          (TArray<FOptionValues::Pair,_FOptionValues::Pair> *this,uint amount)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  FString *pFVar4;
  
  Grow(this,amount);
  uVar1 = this->Count;
  uVar2 = uVar1 + amount;
  this->Count = uVar2;
  if (uVar1 < uVar2) {
    pFVar4 = &this->Array[uVar1].Text;
    lVar3 = (ulong)uVar2 - (ulong)uVar1;
    do {
      pFVar4[-1].Chars = (char *)0x723dac;
      pFVar4->Chars = (char *)0x723dac;
      pFVar4 = pFVar4 + 3;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    FString::NullString.RefCount = FString::NullString.RefCount + amount * 2;
  }
  return uVar1;
}

Assistant:

unsigned int Reserve (unsigned int amount)
	{
		Grow (amount);
		unsigned int place = Count;
		Count += amount;
		for (unsigned int i = place; i < Count; ++i)
		{
			::new((void *)&Array[i]) T;
		}
		return place;
	}